

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overflow.h
# Opt level: O0

uint SaturatingAdd<unsigned_int>(uint i,uint j)

{
  long lVar1;
  uint uVar2;
  uint in_ESI;
  int in_EDI;
  long in_FS_OFFSET;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar2 - in_EDI < in_ESI) {
    local_c = std::numeric_limits<unsigned_int>::max();
  }
  else {
    local_c = in_EDI + in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] T SaturatingAdd(const T i, const T j) noexcept
{
    if constexpr (std::numeric_limits<T>::is_signed) {
        if (i > 0 && j > std::numeric_limits<T>::max() - i) {
            return std::numeric_limits<T>::max();
        }
        if (i < 0 && j < std::numeric_limits<T>::min() - i) {
            return std::numeric_limits<T>::min();
        }
    } else {
        if (std::numeric_limits<T>::max() - i < j) {
            return std::numeric_limits<T>::max();
        }
    }
    return i + j;
}